

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall
glu::sl::ShaderParser::parsePipelineProgram(ShaderParser *this,ProgramSpecification *program)

{
  Token TVar1;
  deUint32 dVar2;
  undefined8 extraout_RAX;
  ulong uVar3;
  ShaderParser *this_00;
  ProgramSpecification *this_01;
  allocator<char> local_a9;
  string source;
  string local_50;
  
  advanceToken(this,TOKEN_PIPELINE_PROGRAM);
  while( true ) {
    TVar1 = this->m_curToken;
    uVar3 = (ulong)TVar1;
    if (0x36 < uVar3) break;
    if ((0x3800000030000U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x32) {
        source._M_dataplus._M_p._0_4_ = 3;
        source.field_2._8_4_ = 0;
        stack0xffffffffffffff74 = 0;
        source._M_string_length = 0;
        source.field_2._M_allocated_capacity._0_4_ = 0;
        source.field_2._M_allocated_capacity._4_4_ = 0;
        parseRequirement(this,(CaseRequirement *)&source);
        if ((int)source._M_dataplus._M_p != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,
                     "only extension requirements are allowed inside pipeline program",&local_a9);
          parseError(this,&local_50);
          goto LAB_008f36ae;
        }
        std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
        push_back(&program->requiredExtensions,(value_type *)&source._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&source._M_string_length);
      }
      else {
        if (uVar3 != 0x36) break;
        advanceToken(this);
        dVar2 = parseShaderStageList(this);
        program->activeStages = dVar2;
      }
    }
    else {
      source._M_dataplus._M_p = (pointer)&source.field_2;
      source._M_string_length = 0;
      source.field_2._M_allocated_capacity._0_4_ =
           source.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      advanceToken(this);
      this_00 = (ShaderParser *)0x3;
      assumeToken(this,TOKEN_SHADER_SOURCE);
      parseShaderSource_abi_cxx11_(&local_50,this_00,(this->m_curTokenStr)._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&source,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      advanceToken(this);
      this_01 = program;
      if ((((TVar1 != TOKEN_VERTEX) &&
           (this_01 = (ProgramSpecification *)((program->sources).sources + 1),
           TVar1 != TOKEN_FRAGMENT)) &&
          (this_01 = (ProgramSpecification *)((program->sources).sources + 3),
          TVar1 != TOKEN_TESSELLATION_CONTROL)) &&
         ((this_01 = (ProgramSpecification *)((program->sources).sources + 4),
          TVar1 != TOKEN_TESSELLATION_EVALUATION &&
          (this_01 = (ProgramSpecification *)((program->sources).sources + 2),
          TVar1 != TOKEN_GEOMETRY)))) {
LAB_008f36ae:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)0x0,&local_a9);
        parseError(this,&local_50);
        goto LAB_008f36cc;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_01,(value_type *)&source);
      std::__cxx11::string::~string((string *)&source);
    }
  }
  if (TVar1 == TOKEN_END) {
    advanceToken(this,TOKEN_END);
    if (program->activeStages != 0) {
      return;
    }
  }
  else {
LAB_008f36cc:
    std::operator+(&source,"invalid pipeline program value: ",&this->m_curTokenStr);
    parseError(this,&source);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"program pipeline object must have active stages",
             (allocator<char> *)&local_50);
  parseError(this,&source);
  std::__cxx11::string::~string((string *)&source);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parsePipelineProgram (ProgramSpecification& program)
{
	advanceToken(TOKEN_PIPELINE_PROGRAM);

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_ACTIVE_STAGES)
		{
			advanceToken();
			program.activeStages = parseShaderStageList();
		}
		else if (m_curToken == TOKEN_REQUIRE)
		{
			CaseRequirement requirement;
			parseRequirement(requirement);

			if (requirement.type == CaseRequirement::TYPE_EXTENSION)
				program.requiredExtensions.push_back(requirement.extension);
			else
				parseError("only extension requirements are allowed inside pipeline program");
		}
		else if (m_curToken == TOKEN_VERTEX						||
				 m_curToken == TOKEN_FRAGMENT					||
				 m_curToken == TOKEN_TESSELLATION_CONTROL		||
				 m_curToken == TOKEN_TESSELLATION_EVALUATION	||
				 m_curToken == TOKEN_GEOMETRY)
		{
			const Token	token = m_curToken;
			string		source;

			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();

			switch (token)
			{
				case TOKEN_VERTEX:					program.sources.sources[SHADERTYPE_VERTEX].push_back(source);					break;
				case TOKEN_FRAGMENT:				program.sources.sources[SHADERTYPE_FRAGMENT].push_back(source);					break;
				case TOKEN_TESSELLATION_CONTROL:	program.sources.sources[SHADERTYPE_TESSELLATION_CONTROL].push_back(source);		break;
				case TOKEN_TESSELLATION_EVALUATION:	program.sources.sources[SHADERTYPE_TESSELLATION_EVALUATION].push_back(source);	break;
				case TOKEN_GEOMETRY:				program.sources.sources[SHADERTYPE_GEOMETRY].push_back(source);					break;
				default:
					parseError(DE_FALSE);
			}
		}
		else
			parseError(string("invalid pipeline program value: " + m_curTokenStr));
	}
	advanceToken(TOKEN_END);

	if (program.activeStages == 0)
		parseError("program pipeline object must have active stages");
}